

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetVertexBuffers
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 StartSlot,
          Uint32 NumBuffersSet,IBuffer **ppBuffers,Uint64 *pOffsets,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,SET_VERTEX_BUFFERS_FLAGS Flags)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Uint64 UVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  uint uVar4;
  VertexStreamInfo<Diligent::BufferVkImpl> *pVVar5;
  BufferVkImpl *pBVar6;
  ulong uVar7;
  char (*in_stack_ffffffffffffff68) [46];
  Uint32 StartSlot_local;
  string msg;
  uint local_60;
  Uint32 local_5c;
  String local_58;
  Uint64 *local_38;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,StateTransitionMode);
  Type = (COMMAND_QUEUE_TYPE)NumBuffersSet;
  StartSlot_local = StartSlot;
  local_5c = NumBuffersSet;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetVertexBuffers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x2d2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    Type = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      Type = extraout_DL_00;
    }
  }
  CVar2 = (this->m_Desc).QueueType;
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[17],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)"SetVertexBuffers",(char (*) [17])0x917e3a,(char (*) [22])&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x1f < StartSlot_local) {
    local_58._M_dataplus._M_p._0_4_ = 0x1f;
    FormatString<char[26],unsigned_int,char[30],unsigned_int,char[3]>
              (&msg,(Diligent *)"Start vertex buffer slot ",(char (*) [26])&StartSlot_local,
               (uint *)0x83bf2e,(char (*) [30])&local_58,(uint *)0x8296b1,
               (char (*) [3])in_stack_ffffffffffffff68);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x20 < StartSlot_local + local_5c) {
    local_58._M_dataplus._M_p._0_4_ = (StartSlot_local + local_5c) - 1;
    local_60._0_1_ = '\x1f';
    local_60._1_1_ = '\0';
    local_60._2_1_ = '\0';
    local_60._3_1_ = '\0';
    FormatString<char[45],unsigned_int,char[3],unsigned_int,char[32],unsigned_int,char[3]>
              (&msg,(Diligent *)"The range of vertex buffer slots being set [",
               (char (*) [45])&StartSlot_local,(uint *)0x92ff04,(char (*) [3])&local_58,
               (uint *)"] is out of allowed range  [0, ",(char (*) [32])&local_60,(uint *)0x8296b1,
               (char (*) [3])in_stack_ffffffffffffff68);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
     ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0)) {
    FormatString<char[188]>
              (&msg,(char (*) [188])
                    "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2dc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((Flags & SET_VERTEX_BUFFERS_FLAG_RESET) != SET_VERTEX_BUFFERS_FLAG_NONE) {
    local_38 = pOffsets;
    if (StartSlot_local != 0) {
      pVVar5 = this->m_VertexStreams;
      uVar7 = 0;
      do {
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((pVVar5->pBuffer).m_pObject != (BufferVkImpl *)0x0) {
          msg._M_dataplus._M_p = (pointer)0x0;
          RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&pVVar5->pBuffer);
          (pVVar5->pBuffer).m_pObject = (BufferVkImpl *)0x0;
        }
        pVVar5->Offset = msg._M_string_length;
        RefCntAutoPtr<Diligent::BufferVkImpl>::Release
                  ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
        uVar7 = uVar7 + 1;
        pVVar5 = pVVar5 + 1;
      } while (uVar7 < StartSlot_local);
    }
    if (StartSlot_local + local_5c < this->m_NumVertexStreams) {
      uVar7 = (ulong)(StartSlot_local + local_5c);
      pVVar5 = this->m_VertexStreams + uVar7;
      do {
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((pVVar5->pBuffer).m_pObject != (BufferVkImpl *)0x0) {
          msg._M_dataplus._M_p = (pointer)0x0;
          RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&pVVar5->pBuffer);
          (pVVar5->pBuffer).m_pObject = (BufferVkImpl *)0x0;
        }
        pVVar5->Offset = msg._M_string_length;
        RefCntAutoPtr<Diligent::BufferVkImpl>::Release
                  ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
        uVar7 = uVar7 + 1;
        pVVar5 = pVVar5 + 1;
      } while (uVar7 < this->m_NumVertexStreams);
    }
    this->m_NumVertexStreams = 0;
    pOffsets = local_38;
  }
  uVar4 = StartSlot_local + local_5c;
  if (StartSlot_local + local_5c < this->m_NumVertexStreams) {
    uVar4 = this->m_NumVertexStreams;
  }
  this->m_NumVertexStreams = uVar4;
  local_60 = 0;
  if (local_5c != 0) {
    do {
      uVar4 = StartSlot_local + local_60;
      if (ppBuffers == (IBuffer **)0x0) {
        pBVar6 = (BufferVkImpl *)0x0;
      }
      else {
        pBVar6 = (BufferVkImpl *)ppBuffers[local_60];
        if (pBVar6 != (BufferVkImpl *)0x0) {
          CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar6);
        }
      }
      pVVar5 = this->m_VertexStreams + uVar4;
      RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(&pVVar5->pBuffer,pBVar6);
      if (pOffsets == (Uint64 *)0x0) {
        UVar3 = 0;
      }
      else {
        UVar3 = pOffsets[local_60];
      }
      pVVar5->Offset = UVar3;
      pBVar6 = (pVVar5->pBuffer).m_pObject;
      if ((pBVar6 != (BufferVkImpl *)0x0) &&
         (((pBVar6->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.BindFlags & BIND_VERTEX_BUFFER) == BIND_NONE)) {
        local_58._M_dataplus._M_p =
             (pBVar6->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.super_DeviceObjectAttribs.Name;
        if (local_58._M_dataplus._M_p == (char *)0x0) {
          local_58._M_dataplus._M_p = "";
        }
        FormatString<char[9],char_const*,char[40],unsigned_int,char[46]>
                  (&msg,(Diligent *)0x8239f8,(char (*) [9])&local_58,
                   (char **)"\' being bound as vertex buffer to slot ",(char (*) [40])&local_60,
                   (uint *)" was not created with BIND_VERTEX_BUFFER flag",in_stack_ffffffffffffff68
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"SetVertexBuffers",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x2f6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      local_60 = local_60 + 1;
    } while (local_60 < local_5c);
  }
  uVar4 = this->m_NumVertexStreams;
  if (uVar4 != 0) {
    do {
      if (this->m_VertexStreams[uVar4 - 1].pBuffer.m_pObject != (BufferVkImpl *)0x0) break;
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 0;
      this->m_NumVertexStreams = uVar4 - 1;
      pVVar5 = this->m_VertexStreams + uVar4;
      if (this->m_VertexStreams[uVar4].pBuffer.m_pObject != (BufferVkImpl *)0x0) {
        msg._M_dataplus._M_p = (pointer)0x0;
        RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&pVVar5->pBuffer);
        (pVVar5->pBuffer).m_pObject = (BufferVkImpl *)0x0;
      }
      pVVar5->Offset = msg._M_string_length;
      RefCntAutoPtr<Diligent::BufferVkImpl>::Release((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
      uVar4 = this->m_NumVertexStreams;
    } while (uVar4 != 0);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetVertexBuffers;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetVertexBuffers(
    Uint32                         StartSlot,
    Uint32                         NumBuffersSet,
    IBuffer* const*                ppBuffers,
    const Uint64*                  pOffsets,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,
    SET_VERTEX_BUFFERS_FLAGS       Flags)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetVertexBuffers");

    DEV_CHECK_ERR(StartSlot < MAX_BUFFER_SLOTS, "Start vertex buffer slot ", StartSlot, " is out of allowed range [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(StartSlot + NumBuffersSet <= MAX_BUFFER_SLOTS,
                  "The range of vertex buffer slots being set [", StartSlot, ", ", StartSlot + NumBuffersSet - 1,
                  "] is out of allowed range  [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    if (Flags & SET_VERTEX_BUFFERS_FLAG_RESET)
    {
        // Reset only these buffer slots that are not being set.
        // It is very important to not reset buffers that stay unchanged
        // as AddRef()/Release() are not free
        for (Uint32 s = 0; s < StartSlot; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        for (Uint32 s = StartSlot + NumBuffersSet; s < m_NumVertexStreams; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        m_NumVertexStreams = 0;
    }
    m_NumVertexStreams = (std::max)(m_NumVertexStreams, StartSlot + NumBuffersSet);

    for (Uint32 Buff = 0; Buff < NumBuffersSet; ++Buff)
    {
        VertexStreamInfo<BufferImplType>& CurrStream{m_VertexStreams[StartSlot + Buff]};
        CurrStream.pBuffer = ppBuffers ? ClassPtrCast<BufferImplType>(ppBuffers[Buff]) : nullptr;
        CurrStream.Offset  = pOffsets ? pOffsets[Buff] : 0;
#ifdef DILIGENT_DEVELOPMENT
        if (CurrStream.pBuffer)
        {
            const BufferDesc& BuffDesc = CurrStream.pBuffer->GetDesc();
            DEV_CHECK_ERR((BuffDesc.BindFlags & BIND_VERTEX_BUFFER) != 0,
                          "Buffer '", BuffDesc.Name ? BuffDesc.Name : "", "' being bound as vertex buffer to slot ", Buff,
                          " was not created with BIND_VERTEX_BUFFER flag");
        }
#endif
    }
    // Remove null buffers from the end of the array
    while (m_NumVertexStreams > 0 && !m_VertexStreams[m_NumVertexStreams - 1].pBuffer)
        m_VertexStreams[m_NumVertexStreams--] = VertexStreamInfo<BufferImplType>{};

    ++m_Stats.CommandCounters.SetVertexBuffers;
}